

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O1

void __thiscall
dg::vr::RelationsAnalyzer::solveDifferent
          (RelationsAnalyzer *this,ValueRelations *graph,BinaryOperator *op)

{
  BinaryOperator BVar1;
  V pVVar2;
  int iVar3;
  Type TVar4;
  uint uVar5;
  Type TVar6;
  V rt;
  ulong uVar7;
  Relations RVar8;
  byte bVar9;
  pointer ppVVar10;
  V pVVar11;
  long lVar12;
  bool bVar13;
  pair<const_llvm::ConstantInt_*,_dg::vr::Relations> pVar14;
  V param;
  V val;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> sample;
  V local_68;
  BinaryOperator *local_60;
  _Base_bitset<1UL> local_58;
  long local_50;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> local_48;
  
  BVar1 = op[0x10];
  pVVar2 = *(V *)(op + -0x40);
  if (pVVar2[0x10] == (Value)0x10) {
    if (BVar1 == (BinaryOperator)0x2a) {
      local_68 = (V)0x0;
      pVVar11 = (V)0x0;
    }
    else {
      local_68 = *(V *)(op + -0x20);
      pVVar11 = pVVar2;
    }
  }
  else {
    pVVar11 = *(V *)(op + -0x20);
    local_68 = pVVar2;
  }
  if (local_68 == (V)0x0) {
    return;
  }
  local_60 = op;
  if (BVar1 == (BinaryOperator)0x28) {
    uVar5 = *(uint *)(pVVar11 + 0x20);
    if (uVar5 < 0x41) {
      bVar13 = *(long *)(pVVar11 + 0x18) == 1;
    }
    else {
      iVar3 = llvm::APInt::countLeadingZerosSlowCase();
      bVar13 = iVar3 == uVar5 - 1;
    }
    if (!bVar13) goto LAB_0011e592;
  }
  else {
LAB_0011e592:
    if ((BVar1 != (BinaryOperator)0x2a) ||
       (bVar13 = llvm::APInt::isAllOnes((APInt *)(pVVar11 + 0x18)), !bVar13)) {
      if ((BVar1 != (BinaryOperator)0x28) ||
         (bVar13 = llvm::APInt::isAllOnes((APInt *)(pVVar11 + 0x18)), !bVar13)) {
        if (BVar1 != (BinaryOperator)0x2a) {
          return;
        }
        uVar5 = *(uint *)(pVVar11 + 0x20);
        if (uVar5 < 0x41) {
          bVar13 = *(long *)(pVVar11 + 0x18) == 1;
        }
        else {
          iVar3 = llvm::APInt::countLeadingZerosSlowCase();
          bVar13 = iVar3 == uVar5 - 1;
        }
        if (!bVar13) {
          return;
        }
      }
      TVar6 = SGT;
      lVar12 = -1;
      goto LAB_0011e602;
    }
  }
  TVar6 = SLT;
  lVar12 = 1;
LAB_0011e602:
  bVar13 = canShift(this,graph,local_68,TVar6);
  if (bVar13) {
    local_50 = lVar12;
    ValueRelations::set<llvm::Value_const*,llvm::BinaryOperator_const*>
              (graph,&local_68,TVar6,&local_60);
    local_58._M_w = 1L << (sbyte)TVar6;
    ValueRelations::getDirectlyRelated(&local_48,graph,local_68,(Relations *)&local_58);
    if (local_48.super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_48.super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      ppVVar10 = local_48.
                 super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      do {
        local_58._M_w = (_WordT)*ppVVar10;
        TVar4 = dg::vr::Relations::getNonStrict(TVar6);
        ValueRelations::set<llvm::BinaryOperator_const*,llvm::Value_const*>
                  (graph,&local_60,TVar4,(Value **)&local_58);
        ppVVar10 = ppVVar10 + 1;
      } while (ppVVar10 !=
               local_48.
               super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl
               .super__Vector_impl_data._M_finish);
    }
    TVar4 = dg::vr::Relations::getNonStrict(TVar6);
    pVar14 = ValueRelations::getBound<llvm::Value_const*>(graph,&local_68,TVar4);
    rt = (V)pVar14.first;
    if ((rt != (V)0x0) &&
       (uVar7 = dg::vr::Relations::getNonStrict(TVar6),
       ((ulong)pVar14.second.bits.super__Base_bitset<1UL>._M_w.bits >> (uVar7 & 0x3f) & 1) != 0)) {
      uVar5 = dg::vr::Relations::getNonStrict(TVar6);
      RVar8 = ValueRelations::_between(graph,(V)local_60,rt);
      if (((ulong)RVar8.bits.super__Base_bitset<1UL>._M_w >> ((ulong)uVar5 & 0x3f) & 1) == 0) {
        if (*(uint *)(rt + 0x20) < 0x41) {
          bVar9 = -(char)*(uint *)(rt + 0x20);
          lVar12 = (*(long *)(rt + 0x18) << (bVar9 & 0x3f)) >> (bVar9 & 0x3f);
        }
        else {
          lVar12 = **(long **)(rt + 0x18);
        }
        local_58._M_w = llvm::ConstantInt::get(*(IntegerType **)rt,lVar12 + local_50,true);
        TVar6 = dg::vr::Relations::getNonStrict(TVar6);
        ValueRelations::set<llvm::BinaryOperator_const*,llvm::ConstantInt_const*>
                  (graph,&local_60,TVar6,(ConstantInt **)&local_58);
      }
    }
    if (local_48.super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void RelationsAnalyzer::solveDifferent(ValueRelations &graph,
                                       const llvm::BinaryOperator *op) {
    auto opcode = op->getOpcode();

    V param = nullptr;
    llvm::ConstantInt *c = nullptr;
    std::tie(param, c) = getParams(op);

    if (!param)
        return;

    assert(param && c);

    Relations::Type shift;
    if ((opcode == llvm::Instruction::Add && c->isOne()) ||
        (opcode == llvm::Instruction::Sub && c->isMinusOne())) {
        shift = Relations::SLT;
    } else if ((opcode == llvm::Instruction::Add && c->isMinusOne()) ||
               (opcode == llvm::Instruction::Sub && c->isOne())) {
        shift = Relations::SGT;
    } else
        return;

    if (canShift(graph, param, shift)) {
        graph.set(param, shift, op);

        std::vector<V> sample =
                graph.getDirectlyRelated(param, Relations().set(shift));

        for (V val : sample) {
            assert(graph.are(param, shift, val));
            graph.set(op, Relations::getNonStrict(shift), val);
        }

        auto boundC = graph.getBound(param, Relations::getNonStrict(shift));
        if (boundC.first && boundC.second.has(Relations::getNonStrict(shift)) &&
            !graph.are(op, Relations::getNonStrict(shift), boundC.first)) {
            int64_t intC = boundC.first->getSExtValue();
            intC += shift == Relations::SLT ? 1 : -1;
            const auto *newBound =
                    llvm::ConstantInt::get(boundC.first->getType(), intC, true);
            graph.set(op, Relations::getNonStrict(shift), newBound);
        }
    }
}